

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O0

double __thiscall cp::PlanFootprints::isCollisionLegs(PlanFootprints *this,double yn,double yb)

{
  double yb_local;
  double yn_local;
  PlanFootprints *this_local;
  
  if ((*(int *)(this + 0x2e0) != 0) || (0.0 <= yn)) {
    this_local = (PlanFootprints *)yb;
    if ((*(int *)(this + 0x2e0) == 1) &&
       ((0.0 <= yn && (this_local = (PlanFootprints *)yn, yb < 0.0)))) {
      this_local = (PlanFootprints *)0x0;
    }
  }
  else {
    this_local = (PlanFootprints *)yn;
    if (0.0 < yb) {
      this_local = (PlanFootprints *)0x0;
    }
  }
  return (double)this_local;
}

Assistant:

double PlanFootprints::isCollisionLegs(double yn, double yb) {
  if (swingleg == right && yn < 0) {
    if (yb > 0) return 0.0;
    else return yn;
  } else if (swingleg == left && yn >= 0) {
    if (yb < 0) return 0.0;
    else return yn;
  } else {
    return yb;
  }
}